

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O1

void UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UChar UVar1;
  ushort uVar2;
  UConverter *pUVar3;
  void *pvVar4;
  UConverter *pUVar5;
  long lVar6;
  uint16_t *puVar7;
  int32_t *cx;
  UChar *pUVar8;
  UErrorCode UVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *targetLimit;
  UConverterSharedData *pUVar18;
  UChar *pUVar19;
  UChar *pUVar20;
  UConverter *saveConv;
  UChar *pUVar21;
  char cVar22;
  UConverterDataISO2022 *myConverterData;
  bool bVar23;
  uint32_t targetByteUnit;
  char local_69;
  int32_t *offsets;
  int local_5c;
  UConverterSharedData *local_58;
  UChar *local_50;
  byte *local_48;
  UErrorCode *local_40;
  byte *local_38;
  
  pUVar20 = args->source;
  pUVar19 = args->sourceLimit;
  pbVar17 = (byte *)args->target;
  targetLimit = (byte *)args->targetLimit;
  offsets = args->offsets;
  targetByteUnit = 0;
  pUVar3 = args->converter;
  pvVar4 = pUVar3->extraInfo;
  pUVar5 = *(UConverter **)((long)pvVar4 + 0x50);
  if (*(int *)((long)pvVar4 + 0x6c) == 1) {
    args->converter = pUVar5;
    pUVar5->fromUChar32 = pUVar3->fromUChar32;
    ucnv_MBCSFromUnicodeWithOffsets_63(args,err);
    lVar6 = *(long *)((long)pvVar4 + 0x50);
    pUVar3->fromUChar32 = *(UChar32 *)(lVar6 + 0x54);
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
      if (0 < (long)*(char *)(lVar6 + 0x5b)) {
        memcpy(pUVar3->charErrorBuffer,(void *)(lVar6 + 0x68),(long)*(char *)(lVar6 + 0x5b));
      }
      lVar6 = *(long *)((long)pvVar4 + 0x50);
      pUVar3->charErrorBufferLength = *(int8_t *)(lVar6 + 0x5b);
      *(undefined1 *)(lVar6 + 0x5b) = 0;
    }
    args->converter = pUVar3;
  }
  else {
    cVar22 = (char)pUVar3->fromUnicodeStatus;
    uVar11 = pUVar3->fromUChar32;
    if (uVar11 == 0 || targetLimit <= pbVar17) {
      if (pUVar20 < pUVar19) {
        pUVar18 = pUVar5->sharedData;
        local_69 = pUVar3->useFallback;
        local_5c = (int)local_69;
        pUVar8 = pUVar20;
        pUVar21 = pUVar20;
        local_58 = pUVar18;
        local_50 = pUVar19;
        local_48 = targetLimit;
        local_40 = err;
        do {
          pUVar20 = pUVar8;
          pUVar21 = pUVar21 + 1;
          targetByteUnit = 0xffff;
          if (args->targetLimit <= pbVar17) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            goto LAB_003956f9;
          }
          UVar1 = *pUVar20;
          uVar11 = (uint)(ushort)UVar1;
          if ((uVar11 < 0x20) && ((0x800c000U >> (uVar11 & 0x1f) & 1) != 0)) {
            *err = U_ILLEGAL_CHAR_FOUND;
            args->converter->fromUChar32 = uVar11;
            pUVar20 = pUVar20 + 1;
            goto LAB_003956f9;
          }
          puVar7 = (pUVar18->mbcs).fromUnicodeTable;
          uVar10 = *(uint *)(puVar7 + (ulong)(((ushort)UVar1 >> 4 & 0x3f) +
                                             (uint)puVar7[(ushort)UVar1 >> 10]) * 2);
          uVar2 = *(ushort *)
                   ((pUVar18->mbcs).fromUnicodeBytes +
                   (ulong)((uVar10 & 0xffff) << 4 | uVar11 & 0xf) * 2);
          if (((uVar10 >> (sbyte)(uVar11 & 0xf)) >> 0x10 & 1) == 0) {
            if ((local_69 != '\0' || 0xffffe6ff < uVar11 - 0xf900) && (uVar2 != 0)) {
              uVar10 = uVar2 < 0x100 | 0xfffffffe;
              goto LAB_00395475;
            }
            cx = (pUVar18->mbcs).extIndexes;
            if (cx == (int32_t *)0x0) {
              uVar10 = 0;
            }
            else {
              uVar10 = ucnv_extSimpleMatchFromU_63(cx,uVar11,&targetByteUnit,(UBool)local_5c);
              targetLimit = local_48;
              pUVar18 = local_58;
              err = local_40;
              pUVar19 = local_50;
            }
          }
          else {
            uVar10 = 2 - (uVar2 < 0x100);
LAB_00395475:
            targetByteUnit = (uint32_t)uVar2;
          }
          uVar14 = -uVar10;
          if (0 < (int)uVar10) {
            uVar14 = uVar10;
          }
          if (((uVar10 == 0 || 2 < uVar14) || (uVar14 == 1 && 0x7f < targetByteUnit)) ||
             ((uVar14 == 2 &&
              ((0x5d5d < (targetByteUnit + 0x5e5f & 0xfffe) ||
               (0x5d < (targetByteUnit + 0x5f & 0xfe))))))) {
            targetByteUnit = 0xffff;
          }
          if (targetByteUnit == 0xffff) {
            pUVar20 = pUVar20 + 1;
            UVar9 = U_INVALID_CHAR_FOUND;
            if (((uVar11 & 0xf800) != 0xd800) ||
               (UVar9 = U_ILLEGAL_CHAR_FOUND, ((ushort)UVar1 >> 10 & 1) != 0)) goto LAB_00395375;
            goto LAB_00395337;
          }
          bVar23 = 0xff < targetByteUnit;
          pbVar16 = pbVar17;
          if ((int)cVar22 != (uint)bVar23) {
            *pbVar17 = 0xff < targetByteUnit ^ 0xf;
            pbVar16 = pbVar17 + 1;
            if (offsets != (int32_t *)0x0) {
              *offsets = (int)((ulong)((long)pUVar21 - (long)args->source) >> 1) + -1;
              offsets = offsets + 1;
            }
          }
          bVar12 = (byte)targetByteUnit;
          if (targetByteUnit < 0x100) {
            if (pbVar16 < targetLimit) {
              *pbVar16 = bVar12;
              pbVar17 = pbVar16 + 1;
LAB_00395572:
              if (offsets != (int32_t *)0x0) {
                *offsets = (int)((ulong)((long)pUVar21 - (long)args->source) >> 1) + -1;
                offsets = offsets + 1;
              }
            }
            else {
              pUVar3 = args->converter;
              cVar22 = pUVar3->charErrorBufferLength;
              pUVar3->charErrorBufferLength = cVar22 + '\x01';
              pUVar3->charErrorBuffer[cVar22] = bVar12;
LAB_00395618:
              *err = U_BUFFER_OVERFLOW_ERROR;
              pbVar17 = pbVar16;
            }
          }
          else {
            bVar13 = (char)(targetByteUnit >> 8) + 0x80;
            if (targetLimit <= pbVar16) {
              pUVar3 = args->converter;
              cVar22 = pUVar3->charErrorBufferLength;
              pUVar3->charErrorBufferLength = cVar22 + '\x01';
              pUVar3->charErrorBuffer[cVar22] = bVar13;
              pUVar3 = args->converter;
              cVar22 = pUVar3->charErrorBufferLength;
              pUVar3->charErrorBufferLength = cVar22 + '\x01';
              pUVar3->charErrorBuffer[cVar22] = bVar12 + 0x80;
              goto LAB_00395618;
            }
            *pbVar16 = bVar13;
            if (offsets != (int32_t *)0x0) {
              *offsets = (int)((ulong)((long)pUVar21 - (long)args->source) >> 1) + -1;
              offsets = offsets + 1;
            }
            pbVar17 = pbVar16 + 1;
            if (pbVar17 < targetLimit) {
              pbVar16[1] = bVar12 + 0x80;
              pbVar17 = pbVar16 + 2;
              goto LAB_00395572;
            }
            pUVar3 = args->converter;
            cVar22 = pUVar3->charErrorBufferLength;
            pUVar3->charErrorBufferLength = cVar22 + '\x01';
            pUVar3->charErrorBuffer[cVar22] = bVar12 + 0x80;
            *err = U_BUFFER_OVERFLOW_ERROR;
            pUVar18 = local_58;
          }
          pUVar8 = pUVar20 + 1;
          cVar22 = bVar23;
        } while (pUVar20 + 1 < pUVar19);
        pUVar20 = pUVar20 + 1;
      }
    }
    else {
LAB_00395337:
      UVar9 = U_ZERO_ERROR;
      if (pUVar20 < pUVar19) {
        bVar23 = ((ushort)*pUVar20 & 0xfc00) == 0xdc00;
        UVar9 = !bVar23 + 10 + (uint)!bVar23;
        uVar10 = uVar11 * 0x400 + (uint)(ushort)*pUVar20 + 0xfca02400;
        if (!bVar23) {
          uVar10 = uVar11;
        }
        uVar11 = uVar10;
        pUVar20 = pUVar20 + bVar23;
      }
LAB_00395375:
      *err = UVar9;
      args->converter->fromUChar32 = uVar11;
    }
LAB_003956f9:
    local_38 = pbVar17;
    if ((((*err < U_ILLEGAL_ARGUMENT_ERROR) && (cVar22 != '\0')) && (args->flush != '\0')) &&
       ((pUVar19 <= pUVar20 && (args->converter->fromUChar32 == 0)))) {
      pUVar19 = args->source;
      iVar15 = (int)((ulong)((long)pUVar20 - (long)pUVar19) >> 1);
      if (iVar15 < 1) {
        uVar11 = 0xffffffff;
      }
      else {
        uVar11 = iVar15 - 1;
        if (((pUVar19[uVar11] & 0xfc00U) == 0xdc00) &&
           ((uVar11 == 0 || ((pUVar19[iVar15 - 2] & 0xfc00U) == 0xd800)))) {
          uVar11 = iVar15 - 2;
        }
      }
      ucnv_fromUWriteBytes_63
                (args->converter,"\x0f",1,(char **)&local_38,(char *)targetLimit,&offsets,uVar11,err
                );
      cVar22 = '\0';
    }
    args->source = pUVar20;
    args->target = (char *)local_38;
    args->converter->fromUnicodeStatus = (int)cVar22;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){

    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UBool isTargetByteDBCS;
    UBool oldIsTargetByteDBCS;
    UConverterDataISO2022 *converterData;
    UConverterSharedData* sharedData;
    UBool useFallback;
    int32_t length =0;

    converterData=(UConverterDataISO2022*)args->converter->extraInfo;
    /* if the version is 1 then the user is requesting
     * conversion with ibm-25546 pass the arguments to
     * MBCS converter and return
     */
    if(converterData->version==1){
        UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize data */
    sharedData = converterData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;
    isTargetByteDBCS=(UBool)args->converter->fromUnicodeStatus;
    oldIsTargetByteDBCS = isTargetByteDBCS;

    isTargetByteDBCS   = (UBool) args->converter->fromUnicodeStatus;
    if((sourceChar = args->converter->fromUChar32)!=0 && target <targetLimit) {
        goto getTrail;
    }
    while(source < sourceLimit){

        targetByteUnit = missingCharMarker;

        if(target < (unsigned char*) args->targetLimit){
            sourceChar = *source++;

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                args->converter->fromUChar32=sourceChar;
                break;
            }

            length = MBCS_FROM_UCHAR32_ISO2022(sharedData,sourceChar,&targetByteUnit,useFallback,MBCS_OUTPUT_2);
            if(length < 0) {
                length = -length;  /* fallback */
            }
            /* only DBCS or SBCS characters are expected*/
            /* DB characters with high bit set to 1 are expected */
            if( length > 2 || length==0 ||
                (length == 1 && targetByteUnit > 0x7f) ||
                (length == 2 &&
                    ((uint16_t)(targetByteUnit - 0xa1a1) > (0xfefe - 0xa1a1) ||
                    (uint8_t)(targetByteUnit - 0xa1) > (0xfe - 0xa1)))
            ) {
                targetByteUnit=missingCharMarker;
            }
            if (targetByteUnit != missingCharMarker){

                oldIsTargetByteDBCS = isTargetByteDBCS;
                isTargetByteDBCS = (UBool)(targetByteUnit>0x00FF);
                  /* append the shift sequence */
                if (oldIsTargetByteDBCS != isTargetByteDBCS ){

                    if (isTargetByteDBCS)
                        *target++ = UCNV_SO;
                    else
                        *target++ = UCNV_SI;
                    if(offsets)
                        *(offsets++) = (int32_t)(source - args->source-1);
                }
                /* write the targetUniChar  to target */
                if(targetByteUnit <= 0x00FF){
                    if( target < targetLimit){
                        *(target++) = (unsigned char) targetByteUnit;
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }

                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }else{
                    if(target < targetLimit){
                        *(target++) =(unsigned char) ((targetByteUnit>>8) -0x80);
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }
                        if(target < targetLimit){
                            *(target++) =(unsigned char) (targetByteUnit -0x80);
                            if(offsets){
                                *(offsets++) = (int32_t)(source - args->source-1);
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit -0x80);
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        }
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) ((targetByteUnit>>8) -0x80);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit-0x80);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassingned
                 * set the error and reason
                 */

                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(sourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(source <  sourceLimit) {
                            /* test the following code unit */
                            UChar trail=(UChar) *source;
                            if(U16_IS_TRAIL(trail)) {
                                source++;
                                sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                                *err = U_INVALID_CHAR_FOUND;
                                /* convert this surrogate code point */
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=sourceChar;
                break;
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-KR conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        isTargetByteDBCS &&
        args->flush && source>=sourceLimit && args->converter->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        isTargetByteDBCS=FALSE;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            args->converter,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
    args->converter->fromUnicodeStatus = (uint32_t)isTargetByteDBCS;
}